

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcolumnview.cpp
# Opt level: O3

void QColumnView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long in_FS_OFFSET;
  void *local_38;
  void *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    local_30 = _a[1];
    local_38 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_38);
  }
  if (_c == ReadProperty) {
    if (_id == 0) {
      *(undefined1 *)*_a = *(undefined1 *)(*(long *)(_o + 8) + 0x570);
    }
  }
  else if (_c == WriteProperty) {
    if (_id == 0) {
      setResizeGripsVisible((QColumnView *)_o,**_a);
    }
  }
  else if (((_c == IndexOfMethod) && (*_a[1] == updatePreviewWidget)) &&
          (*(long *)((long)_a[1] + 8) == 0)) {
    *(undefined4 *)*_a = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QColumnView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updatePreviewWidget((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QColumnView::*)(const QModelIndex & )>(_a, &QColumnView::updatePreviewWidget, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->resizeGripsVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setResizeGripsVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}